

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O2

uint8_t * VP8BitWriterFinish(VP8BitWriter *bw)

{
  VP8PutBits(bw,0,9 - bw->nb_bits_);
  bw->nb_bits_ = 0;
  Flush(bw);
  return bw->buf_;
}

Assistant:

uint8_t* VP8BitWriterFinish(VP8BitWriter* const bw) {
  VP8PutBits(bw, 0, 9 - bw->nb_bits_);
  bw->nb_bits_ = 0;   // pad with zeroes
  Flush(bw);
  return bw->buf_;
}